

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * get_proto_name(mg_connection *conn)

{
  char *local_28;
  char *proto;
  mg_request_info *ri;
  mg_connection *conn_local;
  
  if (conn->protocol_type == 1) {
    local_28 = "ws";
    if ((conn->request_info).is_ssl != 0) {
      local_28 = "wss";
    }
  }
  else {
    local_28 = "http";
    if ((conn->request_info).is_ssl != 0) {
      local_28 = "https";
    }
  }
  return local_28;
}

Assistant:

static const char *
get_proto_name(const struct mg_connection *conn)
{
#if defined(__clang__)
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wunreachable-code"
	/* Depending on USE_WEBSOCKET and NO_SSL, some oft the protocols might be
	 * not supported. Clang raises an "unreachable code" warning for parts of ?:
	 * unreachable, but splitting into four different #ifdef clauses here is
	 * more complicated.
	 */
#endif

	const struct mg_request_info *ri = &conn->request_info;

	const char *proto = ((conn->protocol_type == PROTOCOL_TYPE_WEBSOCKET)
	                         ? (ri->is_ssl ? "wss" : "ws")
	                         : (ri->is_ssl ? "https" : "http"));

	return proto;

#if defined(__clang__)
#pragma clang diagnostic pop
#endif
}